

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O1

LY_ERR lyd_diff(lyd_node *first,lyd_node *second,uint16_t options,ly_bool nosiblings,lyd_node **diff
               )

{
  LY_ERR LVar1;
  lys_module *plVar2;
  lysc_node *plVar3;
  lysc_node *plVar4;
  ly_ctx *ctx;
  
  if (diff == (lyd_node **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","diff","lyd_diff");
    return LY_EINVAL;
  }
  if (first == (lyd_node *)0x0) {
    if (second == (lyd_node *)0x0) {
      ctx = (ly_ctx *)0x0;
      goto LAB_0011717c;
    }
    plVar3 = second->schema;
    if (plVar3 != (lysc_node *)0x0) goto LAB_00117175;
    plVar2 = (lys_module *)&second[2].schema;
  }
  else {
    plVar3 = first->schema;
    if (plVar3 == (lysc_node *)0x0) {
      plVar2 = (lys_module *)&first[2].schema;
    }
    else {
LAB_00117175:
      plVar2 = plVar3->module;
    }
  }
  ctx = plVar2->ctx;
LAB_0011717c:
  if (second != (lyd_node *)0x0 && first != (lyd_node *)0x0) {
    if (first->schema == (lysc_node *)0x0) {
      plVar3 = (lysc_node *)0x0;
    }
    else {
      plVar3 = first->schema->parent;
    }
    plVar3 = lysc_data_node(plVar3);
    if (second->schema == (lysc_node *)0x0) {
      plVar4 = (lysc_node *)0x0;
    }
    else {
      plVar4 = second->schema->parent;
    }
    plVar4 = lysc_data_node(plVar4);
    if (plVar3 != plVar4) {
      ly_log(ctx,LY_LLERR,LY_EINVAL,
             "Invalid arguments - cannot create diff for unrelated data (%s()).","lyd_diff");
      return LY_EINVAL;
    }
  }
  *diff = (lyd_node *)0x0;
  LVar1 = lyd_diff_siblings_r(first,second,options,nosiblings,diff);
  return LVar1;
}

Assistant:

static LY_ERR
lyd_diff(const struct lyd_node *first, const struct lyd_node *second, uint16_t options, ly_bool nosiblings,
        struct lyd_node **diff)
{
    const struct ly_ctx *ctx;

    LY_CHECK_ARG_RET(NULL, diff, LY_EINVAL);

    if (first) {
        ctx = LYD_CTX(first);
    } else if (second) {
        ctx = LYD_CTX(second);
    } else {
        ctx = NULL;
    }

    if (first && second && (lysc_data_parent(first->schema) != lysc_data_parent(second->schema))) {
        LOGERR(ctx, LY_EINVAL, "Invalid arguments - cannot create diff for unrelated data (%s()).", __func__);
        return LY_EINVAL;
    }

    *diff = NULL;

    return lyd_diff_siblings_r(first, second, options, nosiblings, diff);
}